

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::Mark(RefTable *this,SQCollectable_conflict **chain)

{
  ulong local_28;
  SQUnsignedInteger n;
  RefNode *nodes;
  SQCollectable_conflict **chain_local;
  RefTable *this_local;
  
  n = (SQUnsignedInteger)this->_nodes;
  for (local_28 = 0; local_28 < this->_numofslots; local_28 = local_28 + 1) {
    if (*(int *)n != 0x1000001) {
      SQSharedState::MarkObject((SQObjectPtr *)n,chain);
    }
    n = n + 0x20;
  }
  return;
}

Assistant:

void RefTable::Mark(SQCollectable **chain)
{
    RefNode *nodes = (RefNode *)_nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        if(type(nodes->obj) != OT_NULL) {
            SQSharedState::MarkObject(nodes->obj,chain);
        }
        nodes++;
    }
}